

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O2

Future<LookupResponse> * __thiscall Future<LookupResponse>::get(Future<LookupResponse> *this)

{
  long in_RSI;
  LookupResponse local_70 [88];
  
  if ((*(char *)(in_RSI + 0x70) == '\0') && (*(undefined8 **)(in_RSI + 8) != (undefined8 *)0x0)) {
    (**(code **)**(undefined8 **)(in_RSI + 8))(local_70);
    LookupResponse::operator=((LookupResponse *)(in_RSI + 0x18),local_70);
    LookupResponse::~LookupResponse(local_70);
    *(undefined1 *)(in_RSI + 0x70) = 1;
  }
  LookupResponse::LookupResponse((LookupResponse *)this,(LookupResponse *)(in_RSI + 0x18));
  return this;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }